

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::LE_Detonation_PDU::Encode(LE_Detonation_PDU *this,KDataStream *stream)

{
  KUINT16 KVar1;
  WarheadType WVar2;
  FuseType FVar3;
  EntityType *DTB;
  KDataStream *pKVar4;
  LE_Detonation_PDU *self;
  KDataStream *stream_local;
  LE_Detonation_PDU *this_local;
  
  checkFlagsAndPDULength(this);
  LE_Header::Encode(&this->super_LE_Header,stream);
  KDataStream::operator<<(stream,(this->m_DetonationFlag1Union).m_ui8Flag);
  if ((char)(this->m_DetonationFlag1Union).m_ui8Flag < '\0') {
    KDataStream::operator<<(stream,(this->m_DetonationFlag2Union).m_ui8Flag);
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_TargetID).super_DataTypeBase);
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag >> 2 & 1) != 0) {
    if (((this->m_DetonationFlag1Union).m_ui8Flag >> 1 & 1) == 0) {
      KVar1 = DATA_TYPE::LE_EntityIdentifier::GetEntityID(&this->m_MunitionID);
      KDataStream::operator<<(stream,KVar1);
    }
    else {
      DATA_TYPE::operator<<(stream,&(this->m_MunitionID).super_DataTypeBase);
    }
  }
  if (((this->m_DetonationFlag2Union).m_ui8Flag >> 1 & 1) != 0) {
    if (((this->m_DetonationFlag1Union).m_ui8Flag >> 3 & 1) == 0) {
      KVar1 = DATA_TYPE::LE_EntityIdentifier::GetEntityID(&this->m_EventID);
      KDataStream::operator<<(stream,KVar1);
    }
    else {
      DATA_TYPE::operator<<(stream,&(this->m_EventID).super_DataTypeBase);
    }
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag >> 6 & 1) == 0) {
    DATA_TYPE::operator<<(stream,&(this->m_LocWrldCoord).super_DataTypeBase);
  }
  DATA_TYPE::operator<<(stream,&(this->m_Vel).super_DataTypeBase);
  if (((this->m_DetonationFlag2Union).m_ui8Flag & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_Ori).super_DataTypeBase);
  }
  DTB = DATA_TYPE::Descriptor::GetType(&(this->m_MunitionDesc).super_Descriptor);
  DATA_TYPE::operator<<(stream,&DTB->super_DataTypeBase);
  if (((this->m_DetonationFlag1Union).m_ui8Flag >> 4 & 1) != 0) {
    WVar2 = DATA_TYPE::MunitionDescriptor::GetWarhead(&this->m_MunitionDesc);
    pKVar4 = KDataStream::operator<<(stream,(unsigned_short)WVar2);
    FVar3 = DATA_TYPE::MunitionDescriptor::GetFuse(&this->m_MunitionDesc);
    KDataStream::operator<<(pKVar4,(unsigned_short)FVar3);
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag >> 5 & 1) != 0) {
    KVar1 = DATA_TYPE::MunitionDescriptor::GetQuantity(&this->m_MunitionDesc);
    pKVar4 = KDataStream::operator<<(stream,KVar1);
    KVar1 = DATA_TYPE::MunitionDescriptor::GetRate(&this->m_MunitionDesc);
    KDataStream::operator<<(pKVar4,KVar1);
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag >> 6 & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_LocEntCoord).super_DataTypeBase);
  }
  KDataStream::operator<<(stream,this->m_ui8DetonationResult);
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 != (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) {
    __assert_fail("stream.GetBufferSize() == m_ui16PDULength",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jarvisfriends[P]KDIS/KDIS/PDU/Live_Entity/LE_Detonation_PDU.cpp"
                  ,0x39e,"virtual void KDIS::PDU::LE_Detonation_PDU::Encode(KDataStream &) const");
  }
  return;
}

Assistant:

void LE_Detonation_PDU::Encode( KDataStream & stream ) const
{
    // We need to cast away the const so we can check the flag values are correct
    // Must check the flags before encoding the header since PDU length may change
    LE_Detonation_PDU * self = const_cast<LE_Detonation_PDU*>( this );
    self->checkFlagsAndPDULength();

    LE_Header::Encode( stream );

    stream << m_DetonationFlag1Union.m_ui8Flag;

    // F7: Flag Octet 2
    if( m_DetonationFlag1Union.m_ui8Flag2 )
    {
        stream << m_DetonationFlag2Union.m_ui8Flag;
    }

    // F0: Target Entity ID
    if( m_DetonationFlag1Union.m_ui8TargetId )
    {
        stream << KDIS_STREAM m_TargetID;
    }

    // F2: Munition ID
    if( m_DetonationFlag1Union.m_ui8MunitionId )
    {
        // F1: Site Number and Application Number
        if( m_DetonationFlag1Union.m_ui8MunitionSiteApp )
        {
            stream << KDIS_STREAM m_MunitionID;
        }
        else
        {
            // We cant use the standard encode/decode functions here as not all fields are included.
            stream << m_MunitionID.GetEntityID();
        }
    }

    // G1: Event Number
    if( m_DetonationFlag2Union.m_ui8EventNum )
    {
        // F3: Event ID
        if( m_DetonationFlag1Union.m_ui8EventSiteAppId )
        {
            stream << KDIS_STREAM m_EventID;
        }
        else
        {
            // We cant use the standard encode/decode functions here as not all fields are included.
            stream << m_EventID.GetEntityID();
        }
    }

    // F6: Is the location in world coordinates?
    if( !m_DetonationFlag1Union.m_ui8LocationTyp ) // false means location is in world coords
    {
        stream << KDIS_STREAM m_LocWrldCoord;
    }

    // Velocity
    stream << KDIS_STREAM m_Vel;

    // G0: Munition Orientation
    if( m_DetonationFlag2Union.m_ui8MunitionOri )
    {
        stream << KDIS_STREAM m_Ori;
    }

    // Munition Descriptor
    stream << KDIS_STREAM m_MunitionDesc.GetType();
    // F4: Warhead and Fuse fields of the Munition Descriptor record
    if( m_DetonationFlag1Union.m_ui8WarheadFuse )
    {
        stream << ( KUINT16 )m_MunitionDesc.GetWarhead()
               << ( KUINT16 )m_MunitionDesc.GetFuse();
    }
    // F5: Quantity and Rate fields of the Munition Descriptor record
    if( m_DetonationFlag1Union.m_ui8QuantRate )
    {
        stream << m_MunitionDesc.GetQuantity()
               << m_MunitionDesc.GetRate();
    }

    // Is the location in entity coordinates?
    if( m_DetonationFlag1Union.m_ui8LocationTyp ) // true means location is in entity coords
    {
        stream << KDIS_STREAM m_LocEntCoord;
    }

    // Detonation Result
    stream << m_ui8DetonationResult;

    assert(stream.GetBufferSize() == m_ui16PDULength);
}